

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O1

void Internal_SystemModelComponentInit
               (ON_UUID id,int index,wchar_t *name,ON_ModelComponent *model_component)

{
  bool bVar1;
  ON_UUID_struct local_28;
  
  local_28.Data4 = id.Data4;
  local_28._0_8_ = id._0_8_;
  bVar1 = operator!=(&ON_nil_uuid,&local_28);
  if (bVar1) {
    ON_ModelComponent::SetId(model_component,&local_28);
  }
  if (index != -0x7fffffff) {
    ON_ModelComponent::SetIndex(model_component,index);
  }
  if ((name != (wchar_t *)0x0) && (*name != L'\0')) {
    ON_ModelComponent::SetName(model_component,name);
  }
  ON_ModelComponent::LockAllSettingsExceptName(model_component);
  bVar1 = ON_ModelComponent::NameIsEmpty(model_component);
  if (bVar1) {
    ON_ModelComponent::LockName(model_component);
  }
  return;
}

Assistant:

static void Internal_SystemModelComponentInit(
  ON_UUID id,
  int index,
  const wchar_t* name,
  ON_ModelComponent& model_component
  )
{
  if (ON_nil_uuid != id)
    model_component.SetId(id);
  if (ON_UNSET_INT_INDEX != index)
    model_component.SetIndex(index);
  if (nullptr != name && 0 != name[0])
    model_component.SetName(name);

  // non-empty names are locked after application localization
  model_component.LockAllSettingsExceptName();
  if (model_component.NameIsEmpty())
    model_component.LockName();
}